

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data2pvd.cpp
# Opt level: O2

int transformMercuryToVTK<2ul>(MercuryDataFile *infile,string *prefix)

{
  bool bVar1;
  bool bVar2;
  type pVVar3;
  ostream *poVar4;
  long lVar5;
  int iVar6;
  size_t local_8a0;
  size_t timestepCount;
  VTKPointDescriptor<MercuryParticle<2UL>_> descriptor;
  string strippedPath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_840;
  string local_820;
  string local_800;
  string local_7e0;
  string local_7c0;
  string local_7a0;
  string local_780;
  MercuryTimeStepIterator<2UL> __begin0;
  string local_6f8;
  string local_6d8;
  MercuryTimeStepIterator<2UL> __end0;
  string local_648 [32];
  MercuryTimeStepIterator<2UL> local_628;
  ostringstream filename;
  VTKUnstructuredGrid<MercuryParticle<2UL>_> timeStepFile;
  VTKCollection collection;
  
  descriptor.entries_.
  super__Vector_base<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*,_std::allocator<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  descriptor.positionEntry_ = (VTKPointDescriptorEntry<MercuryParticle<2UL>_> *)0x0;
  descriptor.entries_.
  super__Vector_base<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*,_std::allocator<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  descriptor.entries_.
  super__Vector_base<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*,_std::allocator<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_780,"Position",(allocator *)&collection);
  pVVar3 = VTKPointDescriptor<MercuryParticle<2UL>_>::addProperty<double[3]>
                     (&descriptor,&local_780,0,true);
  std::__cxx11::string::string((string *)&local_7a0,"Velocity",(allocator *)&timeStepFile);
  pVVar3 = VTKPointDescriptor<MercuryParticle<2UL>_>::addProperty<double[3]>
                     (pVVar3,&local_7a0,0x18,false);
  std::__cxx11::string::string((string *)&local_7c0,"Rotation",(allocator *)&filename);
  pVVar3 = VTKPointDescriptor<MercuryParticle<2UL>_>::addProperty<double[3]>
                     (pVVar3,&local_7c0,0x30,false);
  std::__cxx11::string::string((string *)&local_7e0,"AngVelocity",(allocator *)&__begin0);
  pVVar3 = VTKPointDescriptor<MercuryParticle<2UL>_>::addProperty<double[3]>
                     (pVVar3,&local_7e0,0x48,false);
  std::__cxx11::string::string((string *)&local_800,"Radius",(allocator *)&__end0);
  pVVar3 = VTKPointDescriptor<MercuryParticle<2UL>_>::addProperty<double>
                     (pVVar3,&local_800,0x60,false);
  std::__cxx11::string::string((string *)&local_820,"Species",(allocator *)&strippedPath);
  VTKPointDescriptor<MercuryParticle<2UL>_>::addProperty<unsigned_long>
            (pVVar3,&local_820,0x68,false);
  std::__cxx11::string::~string((string *)&local_820);
  std::__cxx11::string::~string((string *)&local_800);
  std::__cxx11::string::~string((string *)&local_7e0);
  std::__cxx11::string::~string((string *)&local_7c0);
  std::__cxx11::string::~string((string *)&local_7a0);
  std::__cxx11::string::~string((string *)&local_780);
  std::operator+(&local_840,prefix,".pvd");
  VTKCollection::VTKCollection(&collection,&local_840);
  std::__cxx11::string::~string((string *)&local_840);
  if (*(int *)(&collection.field_0x20 + *(long *)(collection._0_8_ + -0x18)) != 0) {
    std::enable_if<!((((Log)((signed_char)0))<((Log)-20))||(((Log)0)<((Log)-20))),void>::
    type_Logger<(Log)0>::operator()
              ((type_Logger<(Log)0> *)&logger,
               "Could not open \'%.pvd\' for output.\nPlease make sure you have the appropriate permissions and try again."
               ,prefix);
  }
  timestepCount = 0;
  MercuryDataFile::begin<2ul>(&__begin0,infile);
  __end0.lastReadTimeStep_.numParticles_ = 0;
  __end0.lastReadTimeStep_.time_ = 0.0;
  __end0.lastReadTimeStep_.ID_ = 0;
  __end0.lastReadTimeStep_.dataFile_ = (MercuryDataFile *)0x0;
  __end0.lastReadTimeStep_.storage_.
  super__Vector_base<MercuryParticle<2UL>,_std::allocator<MercuryParticle<2UL>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  __end0.lastReadTimeStep_.storage_.
  super__Vector_base<MercuryParticle<2UL>,_std::allocator<MercuryParticle<2UL>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  __end0.lastReadTimeStep_.storage_.
  super__Vector_base<MercuryParticle<2UL>,_std::allocator<MercuryParticle<2UL>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __end0.isEOFTimeStep_ = true;
  __end0.dataFile_ = (MercuryDataFile *)0x0;
  local_8a0 = 0;
  iVar6 = 0;
  while( true ) {
    MercuryTimeStepIterator<2UL>::MercuryTimeStepIterator(&local_628,&__end0);
    bVar2 = local_628.isEOFTimeStep_;
    bVar1 = __begin0.isEOFTimeStep_;
    std::_Vector_base<MercuryParticle<2UL>,_std::allocator<MercuryParticle<2UL>_>_>::~_Vector_base
              (&local_628.lastReadTimeStep_.storage_.
                super__Vector_base<MercuryParticle<2UL>,_std::allocator<MercuryParticle<2UL>_>_>);
    if (bVar1 == bVar2) break;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&filename);
    poVar4 = std::operator<<((ostream *)&filename,(string *)prefix);
    poVar4 = std::operator<<(poVar4,'_');
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::operator<<(poVar4,".vtu");
    std::__cxx11::stringbuf::str();
    VTKUnstructuredGrid<MercuryParticle<2UL>_>::VTKUnstructuredGrid
              (&timeStepFile,&local_6d8,&descriptor);
    std::__cxx11::string::~string((string *)&local_6d8);
    if (*(int *)(&timeStepFile.field_0x28 + *(long *)(timeStepFile._8_8_ + -0x18)) == 0) {
      if (*(int *)(&infile->field_0x20 + *(long *)(*(long *)infile + -0x18)) != 0) {
        std::enable_if<!((((Log)((signed_char)0))<((Log)-10))||(((Log)0)<((Log)-10))),void>::
        type_Logger<(Log)0>::operator()
                  ((type_Logger<(Log)0> *)&logger,
                   "An IOError occurred during the reading of the input file.\nPlease make sure you are feeding this tool mercury data files."
                  );
        iVar6 = 5;
        goto LAB_001095ad;
      }
      VTKUnstructuredGrid<MercuryParticle<2ul>>::write<MercuryTimeStep<2ul>>
                ((VTKUnstructuredGrid<MercuryParticle<2ul>> *)&timeStepFile,
                 &__begin0.lastReadTimeStep_);
      std::__cxx11::stringbuf::str();
      lVar5 = std::__cxx11::string::rfind((char)&strippedPath,0x2f);
      if (lVar5 != -1) {
        std::__cxx11::string::substr((ulong)local_648,(ulong)&strippedPath);
        std::__cxx11::string::operator=((string *)&strippedPath,local_648);
        std::__cxx11::string::~string(local_648);
      }
      std::__cxx11::string::string((string *)&local_6f8,(string *)&strippedPath);
      VTKCollection::append(&collection,&local_6f8);
      std::__cxx11::string::~string((string *)&local_6f8);
      local_8a0 = local_8a0 + 1;
      timestepCount = local_8a0;
      std::__cxx11::string::~string((string *)&strippedPath);
      bVar1 = true;
    }
    else {
      std::__cxx11::stringbuf::str();
      std::enable_if<!((((Log)((signed_char)0))<((Log)-10))||(((Log)0)<((Log)-10))),void>::
      type_Logger<(Log)0>::operator()
                ((type_Logger<(Log)0> *)&logger,
                 "Could not open \'%\' for output.\nPlease make sure you have the appropriate permissions and try again."
                 ,&strippedPath);
      std::__cxx11::string::~string((string *)&strippedPath);
      iVar6 = 6;
LAB_001095ad:
      bVar1 = false;
    }
    std::ofstream::~ofstream(&timeStepFile.outFile_);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&filename);
    if (!bVar1) break;
    MercuryTimeStepIterator<2UL>::operator++(&__begin0);
  }
  std::_Vector_base<MercuryParticle<2UL>,_std::allocator<MercuryParticle<2UL>_>_>::~_Vector_base
            (&__end0.lastReadTimeStep_.storage_.
              super__Vector_base<MercuryParticle<2UL>,_std::allocator<MercuryParticle<2UL>_>_>);
  std::_Vector_base<MercuryParticle<2UL>,_std::allocator<MercuryParticle<2UL>_>_>::~_Vector_base
            (&__begin0.lastReadTimeStep_.storage_.
              super__Vector_base<MercuryParticle<2UL>,_std::allocator<MercuryParticle<2UL>_>_>);
  timeStepFile.descriptor_ = (VTKPointDescriptor<MercuryParticle<2UL>_> *)0x2;
  std::enable_if<!((((Log)((signed_char)0))<((Log)-5))||(((Log)0)<((Log)-5))),void>::
  type_Logger<(Log)0>::operator()
            ((type_Logger<(Log)0> *)&logger,"Written % timesteps in a %D system.",&timestepCount);
  VTKCollection::~VTKCollection(&collection);
  VTKPointDescriptor<MercuryParticle<2UL>_>::~VTKPointDescriptor(&descriptor);
  return iVar6;
}

Assistant:

int transformMercuryToVTK(MercuryDataFile& infile, std::string prefix)
{
  //We really want to describe our exit code.
  int exitCode = 0;
  
  //We'll set up a descriptor.
  //Let the compiler figure out what the types / dimensions are, that's too
  //much work anyway. Oh and make sure position is used as both a datafield
  //and the actual position of the object.
  VTKPointDescriptor< MercuryParticle<NDIMS> > descriptor;
  descriptor
    .addProperty( "Position",    & MercuryParticle< NDIMS >::position , true)
    .addProperty( "Velocity",    & MercuryParticle< NDIMS >::velocity  )
    .addProperty( "Rotation",    & MercuryParticle< NDIMS >::rotation  )
    .addProperty( "AngVelocity", & MercuryParticle< NDIMS >::angularV  )
    .addProperty( "Radius",      & MercuryParticle< NDIMS >::radius    )
    .addProperty( "Species",     & MercuryParticle< NDIMS >::speciesID );
    
  // We want a Collection file which lists all individual files
  VTKCollection collection( prefix + ".pvd" );
  // First, make sure it is sane.
  if (!collection)
    logger( FATAL, "Could not open '%.pvd' for output.\n"
                   "Please make sure you have the appropriate permissions and try again.", prefix);
  
  std::size_t timestepCount = 0;
  
  //Now, read all the timesteps as if they were NDIMS long.
  for (const MercuryTimeStep<NDIMS> & ts : infile.as<NDIMS>())
  {
    //Generate the filename for the individual data files.
    std::ostringstream filename;
    filename << prefix << '_' << ts.getTimeStepID() << ".vtu";
    
    //We'll set up a datafile containing the individual timestep.
    VTKUnstructuredGrid< MercuryParticle<NDIMS> > timeStepFile(filename.str(), &descriptor);
    if (!timeStepFile) //but not after we've done some sanity checking!
    {
      logger(WARN, "Could not open '%' for output.\n"
                   "Please make sure you have the appropriate permissions and try again.", filename.str());
      exitCode = 6;
      break;
    }
    
    if (!infile) //Some sanity checking? More sanity checking! ALL the sanity checking!!!
    {
      logger(WARN, "An IOError occurred during the reading of the input file.\n"
                   "Please make sure you are feeding this tool mercury data files.");
      exitCode = 5; 
      break;
    }
    //Okay. we done.
    //Let's write.
    timeStepFile.write(ts);
    
    //So, a user may give an output path which is in a different directory. 
    // However, since the index files resides in the same output directory
    // as the timestep files, we need to specify relative paths.
    std::string strippedPath = filename.str();
    //so, we try to find the last / - because to hell with everybody with other
    //path seperators...
    std::string::size_type slashPosition = strippedPath.rfind('/');
    //and take only the last part. It's not the last character, trust me.
    //we checked for that in main().
    if (slashPosition != std::string::npos)
      strippedPath = strippedPath.substr(slashPosition + 1);
    //And now put the relative path in the listing file
    collection.append(strippedPath);
    
    timestepCount++;
  }
  
  logger(INFO, "Written % timesteps in a %D system.", timestepCount, NDIMS);
  
  return exitCode;
}